

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O3

void build_paths_internal(ZNode *z,VecVecZNode *paths,int parent,int n,int n_to_go)

{
  ZNode **ppZVar1;
  int n_00;
  VecZNode *pVVar2;
  SNode **ppSVar3;
  uint uVar4;
  int parent_00;
  SNode *pSVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  uVar8 = (ulong)(uint)parent;
  pVVar2 = paths->v[parent];
  ppZVar1 = pVVar2->v;
  if (ppZVar1 == (ZNode **)0x0) {
    pVVar2->v = pVVar2->e;
    uVar4 = paths->v[parent]->n;
    paths->v[parent]->n = uVar4 + 1;
    pVVar2->e[uVar4] = z;
    goto LAB_0012bc62;
  }
  uVar4 = pVVar2->n;
  if (ppZVar1 == pVVar2->e) {
    if (2 < uVar4) goto LAB_0012bc5a;
  }
  else if ((uVar4 & 7) == 0) {
LAB_0012bc5a:
    vec_add_internal(pVVar2,z);
    goto LAB_0012bc62;
  }
  pVVar2->n = uVar4 + 1;
  ppZVar1[uVar4] = z;
LAB_0012bc62:
  if ((1 < n_to_go) && (uVar4 = (z->sns).n, uVar4 != 0)) {
    n_00 = (n - n_to_go) + 1;
    ppSVar3 = (z->sns).v;
    uVar9 = 0;
    do {
      pSVar5 = ppSVar3[uVar9];
      if ((pSVar5->zns).n != 0) {
        uVar7 = 0;
        iVar6 = 0;
        do {
          if ((pSVar5->zns).v[uVar7] != (ZNode *)0x0) {
            if (uVar9 != (uint)-iVar6) {
              parent_00 = (int)uVar8;
              if (paths->v == (VecZNode **)0x0) {
                pVVar2 = new_VecZNode(paths,n_00,parent_00);
                paths->v = paths->e;
                uVar8 = (ulong)paths->n;
                paths->n = paths->n + 1;
                paths->e[uVar8] = pVVar2;
              }
              else {
                if (paths->v == paths->e) {
                  if (2 < paths->n) goto LAB_0012bd31;
                }
                else if ((paths->n & 7) == 0) {
LAB_0012bd31:
                  pVVar2 = new_VecZNode(paths,n_00,parent_00);
                  vec_add_internal(paths,pVVar2);
                  uVar8 = (ulong)(paths->n - 1);
                  goto LAB_0012bd51;
                }
                pVVar2 = new_VecZNode(paths,n_00,parent_00);
                uVar8 = (ulong)paths->n;
                paths->n = paths->n + 1;
                paths->v[uVar8] = pVVar2;
              }
LAB_0012bd51:
              ppSVar3 = (z->sns).v;
            }
            build_paths_internal((ppSVar3[uVar9]->zns).v[uVar7],paths,(int)uVar8,n,n_to_go + -1);
            iVar6 = iVar6 + 1;
            ppSVar3 = (z->sns).v;
          }
          uVar7 = uVar7 + 1;
          pSVar5 = ppSVar3[uVar9];
        } while (uVar7 < (pSVar5->zns).n);
        uVar4 = (z->sns).n;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < uVar4);
  }
  return;
}

Assistant:

static void build_paths_internal(ZNode *z, VecVecZNode *paths, int parent, int n, int n_to_go) {
  uint j, k, l;

  vec_add(paths->v[parent], z);
  if (n_to_go <= 1) return;
  for (k = 0; k < z->sns.n; k++)
    for (j = 0, l = 0; j < z->sns.v[k]->zns.n; j++) {
      if (z->sns.v[k]->zns.v[j]) {
        if (k + l) {
          vec_add(paths, new_VecZNode(paths, n - (n_to_go - 1), parent));
          parent = paths->n - 1;
        }
        build_paths_internal(z->sns.v[k]->zns.v[j], paths, parent, n, n_to_go - 1);
        l++;
      }
    }
}